

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cc
# Opt level: O2

void __thiscall t_server::f_remove(t_server *this,t_client *a_client)

{
  __normal_iterator<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_> __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<t_client**,std::vector<t_client*,std::allocator<t_client*>>>,__gnu_cxx::__ops::_Iter_equals_val<t_client*const>>
                         ((this->v_clients).
                          super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->v_clients).
                          super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
                          super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_client_*,_std::allocator<t_client_*>_>::erase
              (&this->v_clients,(const_iterator)__position._M_current);
  }
  return;
}

Assistant:

void t_server::f_remove(t_client* a_client)
{
	auto i = std::find(v_clients.begin(), v_clients.end(), a_client);
	if (i != v_clients.end()) v_clients.erase(i);
}